

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

float __thiscall dynet::Trainer::clip_gradients(Trainer *this)

{
  runtime_error *this_00;
  float fVar1;
  float fVar2;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  fVar2 = 1.0;
  if (this->clipping_enabled == true) {
    fVar1 = ParameterCollection::gradient_l2_norm(this->model);
    if (0x7f7fffff < (uint)ABS(fVar1)) {
      std::__cxx11::ostringstream::ostringstream(local_190);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"Magnitude of gradient is bad: ",0x1e);
      std::ostream::_M_insert<double>((double)fVar1);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,local_1b0);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    fVar2 = 1.0;
    if (this->clip_threshold < fVar1) {
      this->clips = this->clips + 1.0;
      this->clips_since_status = this->clips_since_status + 1.0;
      fVar2 = this->clip_threshold / fVar1;
    }
  }
  return fVar2;
}

Assistant:

float Trainer::clip_gradients() {
  float gscale = 1;
  if (clipping_enabled) {
    float gg = model->gradient_l2_norm();
    if (isnan(gg) || isinf(gg)) {
      ostringstream oss; oss << "Magnitude of gradient is bad: " << gg;
      throw std::runtime_error(oss.str());
    }
    if (gg > clip_threshold) {
      ++clips;
      ++clips_since_status;
      gscale = clip_threshold / gg;
    }
  }
  return gscale;
}